

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  PromiseArena *pPVar1;
  long *plVar2;
  undefined8 *puVar3;
  AsyncInputStream AVar4;
  AsyncOutputStream AVar5;
  undefined1 auVar6 [8];
  char *pcVar7;
  size_t sVar8;
  OwnFd *pOVar9;
  int iVar10;
  void *pvVar11;
  TransformPromiseNodeBase *pTVar12;
  long lVar13;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11),_unsigned_long>
  promise2;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  OwnFd sokcetServer;
  OwnFd socketClient;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:605:11),_unsigned_long>
  promise;
  String result2;
  String result;
  Own<kj::AsyncIoStream,_std::nullptr_t> clientStream;
  CapabilityPipe pipe2;
  int socketFds [2];
  AsyncIoContext io;
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  AsyncCapabilityStream local_170;
  undefined1 local_160 [8];
  undefined1 local_158 [8];
  long *plStack_150;
  undefined1 local_140 [8];
  OwnFd local_138;
  OwnFd local_134;
  TransformPromiseNodeBase *local_130;
  String local_128;
  String local_108;
  undefined8 *local_f0;
  long *local_e8;
  Fault local_e0;
  int local_d8 [6];
  int local_c0 [2];
  _func_int *local_b8;
  OwnFd *local_b0;
  undefined8 *local_a8;
  long *local_a0;
  DebugComparison<const_char_(&)[4],_kj::String_&> local_88;
  char *local_60;
  char *pcStack_58;
  byte local_50 [8];
  char *local_48;
  char *pcStack_40;
  byte local_38 [8];
  
  setupAsyncIo();
  local_c0 = (int  [2])0x0;
  do {
    iVar10 = socketpair(1,1,0,local_c0);
    if (-1 < iVar10) goto LAB_002134b9;
    iVar10 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar10 == -1);
  if (iVar10 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_88.left = (char (*) [4])0x0;
    local_88.right = (String *)0x0;
    kj::_::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_e0);
  }
LAB_002134b9:
  local_134.fd = local_c0[0];
  local_138.fd = local_c0[1];
  newCapabilityPipe();
  local_160[4] = '\0';
  local_160[5] = '\0';
  local_160[6] = '\0';
  local_160[7] = '\0';
  local_160[0] = '\0';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  LowLevelAsyncIoProvider::wrapSocketFd
            ((LowLevelAsyncIoProvider *)&local_f0,local_b0,(uint)&local_134);
  AsyncCapabilityStream::sendFd(&local_170,local_d8[0]);
  AVar4._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:601:13)>
               ::anon_class_8_1_cb284929_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0060e1c0;
    *(PromiseArena **)((long)pvVar11 + 0x3f8) = (PromiseArena *)&local_f0;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] =
         (_func_int *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              (local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:601:13)>
               ::anon_class_8_1_cb284929_for_func::operator());
    AVar4._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_0060e1c0;
    AVar4._vptr_AsyncInputStream[-1] = (_func_int *)&local_f0;
    ((PromiseArenaMember *)(AVar4._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_128.content.ptr = (char *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_108,(OwnPromiseNode *)&local_128,(SourceLocation *)&local_88)
  ;
  pcVar7 = local_128.content.ptr;
  local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)local_108.content.ptr;
  if ((TransformPromiseNodeBase *)local_128.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar7);
  }
  AVar5._vptr_AsyncOutputStream =
       local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  pPVar1 = (PromiseArena *)
           local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream -
             (long)pPVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:603:11)>
               ::anon_class_16_2_320fd09c_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0060e218;
    *(PromiseArena **)((long)pvVar11 + 0x3f0) = (PromiseArena *)&local_f0;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_160 + 4;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1] =
         (_func_int *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              (local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream + -6);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:603:11)>
               ::anon_class_16_2_320fd09c_for_func::operator());
    ((PromiseArenaMember *)(AVar5._vptr_AsyncOutputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060e218;
    ((PromiseArenaMember *)(AVar5._vptr_AsyncOutputStream + -2))->_vptr_PromiseArenaMember =
         (_func_int **)&local_f0;
    AVar5._vptr_AsyncOutputStream[-1] = (_func_int *)(local_160 + 4);
    AVar5._vptr_AsyncOutputStream[-5] = (_func_int *)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_128.content.ptr = (char *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_108,(OwnPromiseNode *)&local_128,(SourceLocation *)&local_88)
  ;
  pcVar7 = local_128.content.ptr;
  local_158 = (undefined1  [8])local_108.content.ptr;
  if ((TransformPromiseNodeBase *)local_128.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar7);
  }
  auVar6 = local_158;
  pPVar1 = ((PromiseArenaMember *)local_158)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_158 - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_158,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:605:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0060e270;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_160 + 4;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    ((PromiseArenaMember *)local_158)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)((long)local_158 + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_158,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:605:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    ((PromiseArenaMember *)((long)auVar6 + -0x30))->arena = (PromiseArena *)&PTR_destroy_0060e270;
    ((PromiseArenaMember *)((long)auVar6 + -0x10))->arena = (PromiseArena *)(local_160 + 4);
    ((PromiseArenaMember *)((long)auVar6 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  auVar6 = local_158;
  local_130 = pTVar12;
  if (local_158 != (undefined1  [8])0x0) {
    local_158 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar6);
  }
  AVar5._vptr_AsyncOutputStream =
       local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((PromiseArenaMember *)
      local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (PromiseArenaMember *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar5._vptr_AsyncOutputStream);
  }
  AVar4._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncInputStream);
  }
  local_158 = (undefined1  [8])0x0;
  plStack_150 = (long *)0x0;
  AsyncCapabilityStream::receiveFd((AsyncCapabilityStream *)local_140);
  auVar6 = local_140;
  pPVar1 = *(PromiseArena **)((long)local_140 + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_140 - (long)pPVar1) < 0x38) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3c8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_140,
               kj::_::
               SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:613:13)>
               ::anon_class_24_3_98c709d1_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3c8) = &PTR_destroy_0060e2c8;
    *(undefined1 **)((long)pvVar11 + 1000) = local_158;
    *(_func_int ***)((long)pvVar11 + 0x3f0) = &local_b8;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_160;
    *(void **)((long)pvVar11 + 0x3d0) = pvVar11;
  }
  else {
    *(PromiseArena **)((long)local_140 + 8) = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)((long)local_140 + -0x38);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_140,
               kj::_::
               SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:613:13)>
               ::anon_class_24_3_98c709d1_for_func::operator());
    *(undefined ***)((long)auVar6 + -0x38) = &PTR_destroy_0060e2c8;
    *(PromiseArena **)((long)auVar6 + -0x18) = (PromiseArena *)local_158;
    ((PromiseArenaMember *)((long)auVar6 + -0x10))->_vptr_PromiseArenaMember = &local_b8;
    *(PromiseArena **)((long)auVar6 + -8) = (PromiseArena *)local_160;
    ((PromiseArenaMember *)((long)auVar6 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_128.content.ptr = (char *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_108,(OwnPromiseNode *)&local_128,(SourceLocation *)&local_88)
  ;
  pcVar7 = local_128.content.ptr;
  local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)local_108.content.ptr;
  if ((TransformPromiseNodeBase *)local_128.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar7);
  }
  AVar4._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:616:11)>
               ::anon_class_16_2_5e707987_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0060e378;
    *(undefined1 **)((long)pvVar11 + 0x3f0) = local_158;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_160;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] =
         (_func_int *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              (local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -6);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:616:11)>
               ::anon_class_16_2_5e707987_for_func::operator());
    ((PromiseArenaMember *)(AVar4._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060e378;
    ((PromiseArenaMember *)(AVar4._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember =
         (_func_int **)local_158;
    AVar4._vptr_AsyncInputStream[-1] = (_func_int *)local_160;
    AVar4._vptr_AsyncInputStream[-5] = (_func_int *)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_128.content.ptr = (char *)pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_108,(OwnPromiseNode *)&local_128,(SourceLocation *)&local_88)
  ;
  pcVar7 = local_128.content.ptr;
  local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)local_108.content.ptr;
  if ((TransformPromiseNodeBase *)local_128.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar7);
  }
  AVar4._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncInputStream);
  }
  auVar6 = local_140;
  if (local_140 != (undefined1  [8])0x0) {
    local_140 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar6);
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_40 = "run";
  local_38[0] = 'o';
  local_38[1] = '\x02';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\x17';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  Promise<kj::String>::wait((Promise<kj::String> *)&local_108,&local_130);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_58 = "run";
  local_50[0] = 'p';
  local_50[1] = '\x02';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\x18';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  Promise<kj::String>::wait
            ((Promise<kj::String> *)&local_128,
             &local_170.super_AsyncIoStream.super_AsyncOutputStream);
  local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)0x4b858f;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_88,(DebugExpression<char_const(&)[4]> *)&local_170,&local_108);
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x272,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result",
               (char (*) [37])"failed: expected (\"bar\") == (result)",&local_88,
               (char (*) [4])0x4b858f,&local_108);
  }
  local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)0x4d8ac4;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_88,(DebugExpression<char_const(&)[4]> *)&local_170,&local_128);
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x273,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
               ,(char (*) [38])"failed: expected (\"foo\") == (result2)",&local_88,
               (char (*) [4])0x4d8ac4,&local_128);
  }
  sVar8 = local_128.content.size_;
  pcVar7 = local_128.content.ptr;
  if ((TransformPromiseNodeBase *)local_128.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.content.ptr = (char *)0x0;
    local_128.content.size_ = 0;
    (**(local_128.content.disposer)->_vptr_ArrayDisposer)
              (local_128.content.disposer,pcVar7,1,sVar8,sVar8,0);
  }
  sVar8 = local_108.content.size_;
  pcVar7 = local_108.content.ptr;
  if ((PromiseArenaMember *)local_108.content.ptr != (PromiseArenaMember *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(local_108.content.disposer)->_vptr_ArrayDisposer)
              (local_108.content.disposer,pcVar7,1,sVar8,sVar8,0);
  }
  AVar5._vptr_AsyncOutputStream =
       local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((PromiseArenaMember *)
      local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (PromiseArenaMember *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar5._vptr_AsyncOutputStream);
  }
  plVar2 = plStack_150;
  if (plStack_150 != (long *)0x0) {
    plStack_150 = (long *)0x0;
    (**((PromiseArenaMember *)local_158)->_vptr_PromiseArenaMember)
              (local_158,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pTVar12 = local_130;
  if (local_130 != (TransformPromiseNodeBase *)0x0) {
    local_130 = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar12);
  }
  plVar2 = local_e8;
  if (local_e8 != (long *)0x0) {
    local_e8 = (long *)0x0;
    (**(code **)*local_f0)(local_f0,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  lVar13 = 0x10;
  do {
    plVar2 = *(long **)((long)local_d8 + lVar13);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)local_d8 + lVar13) = 0;
      puVar3 = *(undefined8 **)((long)local_d8 + lVar13 + -8);
      (**(code **)*puVar3)(puVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    lVar13 = lVar13 + -0x10;
  } while (lVar13 != -0x10);
  OwnFd::~OwnFd(&local_138);
  OwnFd::~OwnFd(&local_134);
  plVar2 = local_a0;
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pOVar9 = local_b0;
  if (local_b0 != (OwnFd *)0x0) {
    local_b0 = (OwnFd *)0x0;
    (*(code *)**(undefined8 **)local_b8)
              (local_b8,(long)&pOVar9->fd + *(long *)(*(long *)pOVar9 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, InMemoryCapabilityPipeFdsReverse) {
  // Same as above, except we do sendFd() first, then receiveFd(). This hits `BlockedWrite` instead
  // of `BlockedRead`. At one time there was a bug in that code that mishandled the file
  // descriptors.

  auto io = setupAsyncIo();

  int socketFds[2]{};
  KJ_SYSCALL(socketpair(AF_UNIX, SOCK_STREAM, 0, socketFds));
  kj::OwnFd socketClient(socketFds[0]);
  kj::OwnFd sokcetServer(socketFds[1]);

  auto pipe2 = newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Send an FD, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  auto clientStream = io.lowLevelProvider->wrapSocketFd(kj::mv(socketClient));
  auto promise = pipe2.ends[0]->sendFd(kj::mv(sokcetServer))
      .then([&]() {
    return clientStream->write("foo"_kjb);
  }).then([&]() {
    return clientStream->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  // Expect to receive an FD, then read "foo" from it, then write "bar" to it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise2 = pipe2.ends[1]->receiveFd()
      .then([&](OwnFd fd) {
    receivedStream = io.lowLevelProvider->wrapUnixSocketFd(kj::mv(fd));
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return receivedStream->write("bar"_kjb).then([&receiveBuffer2,n]() {
      return heapString(receiveBuffer2, n);
    });
  });

  kj::String result = promise.wait(io.waitScope);
  kj::String result2 = promise2.wait(io.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}